

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex.h
# Opt level: O3

SizeType __thiscall
rapidjson::internal::GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::Append
          (GenericRegex<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,SizeType l1,
          SizeType l2)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  
  pcVar1 = (this->states_).stack_;
  uVar2 = l1;
  do {
    if (this->stateCount_ <= uVar2) {
      __assert_fail("index < stateCount_",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/internal/regex.h"
                    ,0xaa,
                    "State &rapidjson::internal::GenericRegex<rapidjson::UTF8<>>::GetState(SizeType) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator]"
                   );
    }
    uVar3 = (ulong)uVar2;
    uVar2 = *(uint *)(pcVar1 + uVar3 * 0x10);
  } while (uVar2 != 0xffffffff);
  *(SizeType *)(pcVar1 + uVar3 * 0x10) = l2;
  return l1;
}

Assistant:

SizeType Append(SizeType l1, SizeType l2) {
        SizeType old = l1;
        while (GetState(l1).out != kRegexInvalidState)
            l1 = GetState(l1).out;
        GetState(l1).out = l2;
        return old;
    }